

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

bool Socks5(string *strDest,uint16_t port,ProxyCredentials *auth,Sock *sock)

{
  long lVar1;
  ulong uVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  bool bVar4;
  bool bVar5;
  IntrRecvError IVar6;
  Logger *pLVar7;
  char *pcVar8;
  int iVar9;
  CThreadInterrupt *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  size_t len;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vSocks5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vSocks5Init;
  uint16_t port_local;
  undefined8 local_1f0;
  char *pcStack_1e8;
  uint8_t pchRet2 [4];
  uint8_t pchRet1 [2];
  uint8_t pchRet3 [256];
  undefined8 local_d0;
  char *pcStack_c8;
  uint8_t pchRetA [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  port_local = port;
  bVar4 = LogAcceptCategory(NET,Debug);
  if (bVar4) {
    in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
    source_file_02._M_len = 0x54;
    logging_function._M_str = "Socks5";
    logging_function._M_len = 6;
    LogPrintf_<std::__cxx11::string>
              (logging_function,source_file_02,0x178,NET,Debug,"SOCKS5 connecting %s\n",strDest);
  }
  if (0xff < strDest->_M_string_length) {
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
    source_file_03._M_len = 0x54;
    logging_function_00._M_str = "Socks5";
    logging_function_00._M_len = 6;
    LogPrintf_<>(logging_function_00,source_file_03,0x17a,ALL,Error,"Hostname too long\n");
    bVar4 = false;
    goto LAB_00a9ab67;
  }
  vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pchRet3[0] = '\x05';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&vSocks5Init,pchRet3);
  if (auth == (ProxyCredentials *)0x0) {
    pchRet3[0] = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
    pchRet3._0_8_ = (ulong)(uint7)pchRet3._1_7_ << 8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
  }
  else {
    pchRet3[0] = '\x02';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
    pchRet3[0] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
    pchRet3[0] = '\x02';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
  }
  args_1 = &g_socks5_interrupt;
  (*sock->_vptr_Sock[0x10])
            (sock,vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
             (long)vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,g_socks5_recv_timeout.__r);
  IVar6 = InterruptibleRecv(pchRet1,2,g_socks5_recv_timeout,sock);
  if (IVar6 == OK) {
    if (pchRet1[0] != '\x05') {
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
      source_file_05._M_len = 0x54;
      logging_function_02._M_str = "Socks5";
      logging_function_02._M_len = 6;
      LogPrintf_<>(logging_function_02,source_file_05,399,ALL,Error,"Proxy failed to initialize\n");
      goto LAB_00a9ab5b;
    }
    if (pchRet1[1] == '\x02' && auth != (ProxyCredentials *)0x0) {
      pchRet3[0x10] = '\0';
      pchRet3[0x11] = '\0';
      pchRet3[0x12] = '\0';
      pchRet3[0x13] = '\0';
      pchRet3[0x14] = '\0';
      pchRet3[0x15] = '\0';
      pchRet3[0x16] = '\0';
      pchRet3[0x17] = '\0';
      pchRet3[0] = '\0';
      pchRet3[1] = '\0';
      pchRet3[2] = '\0';
      pchRet3[3] = '\0';
      pchRet3[4] = '\0';
      pchRet3[5] = '\0';
      pchRet3[6] = '\0';
      pchRet3[7] = '\0';
      pchRet3[8] = '\0';
      pchRet3[9] = '\0';
      pchRet3[10] = '\0';
      pchRet3[0xb] = '\0';
      pchRet3[0xc] = '\0';
      pchRet3[0xd] = '\0';
      pchRet3[0xe] = '\0';
      pchRet3[0xf] = '\0';
      pchRetA[0] = '\x01';
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pchRet3,pchRetA);
      uVar2 = (auth->username)._M_string_length;
      if ((uVar2 < 0x100) && ((auth->password)._M_string_length < 0x100)) {
        pchRetA[0] = (uint8_t)uVar2;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pchRet3,pchRetA);
        _Var3._M_current = (auth->username)._M_dataplus._M_p;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)pchRet3,
                   (const_iterator)pchRet3._8_8_,_Var3,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(_Var3._M_current + (auth->username)._M_string_length));
        pchRetA[0] = (uint8_t)(auth->password)._M_string_length;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pchRet3,pchRetA);
        _Var3._M_current = (auth->password)._M_dataplus._M_p;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)pchRet3,
                   (const_iterator)pchRet3._8_8_,_Var3,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(_Var3._M_current + (auth->password)._M_string_length));
        (*sock->_vptr_Sock[0x10])
                  (sock,pchRet3._0_8_,pchRet3._8_8_ - pchRet3._0_8_,g_socks5_recv_timeout.__r,
                   &g_socks5_interrupt);
        bVar4 = LogAcceptCategory(PROXY,Debug);
        if (bVar4) {
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8000;
          source_file_06._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp"
          ;
          source_file_06._M_len = 0x54;
          logging_function_03._M_str = "Socks5";
          logging_function_03._M_len = 6;
          LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                    (logging_function_03,source_file_06,0x19f,PROXY,Debug,
                     "SOCKS5 sending proxy authentication %s:%s\n",&auth->username,&auth->password);
        }
        IVar6 = InterruptibleRecv(pchRetA,2,g_socks5_recv_timeout,sock);
        if (IVar6 == OK) {
          pcVar8 = "Proxy authentication unsuccessful\n";
          iVar9 = 0x1a6;
          if ((pchRetA[0] == '\x01') && (pchRetA[1] == '\0')) {
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pchRet3);
            goto LAB_00a9abbf;
          }
        }
        else {
          pcVar8 = "Error reading proxy authentication response\n";
          iVar9 = 0x1a2;
        }
        source_file_07._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
        source_file_07._M_len = 0x54;
        logging_function_04._M_str = "Socks5";
        logging_function_04._M_len = 6;
        LogPrintf_<>(logging_function_04,source_file_07,iVar9,ALL,Error,pcVar8);
      }
      else {
        source_file_04._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
        source_file_04._M_len = 0x54;
        logging_function_01._M_str = "Socks5";
        logging_function_01._M_len = 6;
        LogPrintf_<>(logging_function_01,source_file_04,0x197,ALL,Error,
                     "Proxy username or password too long\n");
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)pchRet3);
      goto LAB_00a9ab5b;
    }
    if (pchRet1[1] != '\0') {
      pLVar7 = LogInstance();
      bVar4 = BCLog::Logger::Enabled(pLVar7);
      if (bVar4) {
        pchRet3._0_8_ = pchRet3 + 0x10;
        pchRet3[8] = '\0';
        pchRet3[9] = '\0';
        pchRet3[10] = '\0';
        pchRet3[0xb] = '\0';
        pchRet3[0xc] = '\0';
        pchRet3[0xd] = '\0';
        pchRet3[0xe] = '\0';
        pchRet3[0xf] = '\0';
        pchRet3._16_8_ = pchRet3._16_8_ & 0xffffffffffffff00;
        tinyformat::format<unsigned_char>
                  ((string *)pchRetA,"Proxy requested wrong authentication method %02x\n",
                   pchRet1 + 1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pchRet3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pchRetA);
        std::__cxx11::string::~string((string *)pchRetA);
        pLVar7 = LogInstance();
        local_d0 = 0x54;
        pcStack_c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
        source_file_00._M_len = 0x54;
        str_00._M_str = (char *)pchRet3._0_8_;
        str_00._M_len._0_1_ = pchRet3[8];
        str_00._M_len._1_1_ = pchRet3[9];
        str_00._M_len._2_1_ = pchRet3[10];
        str_00._M_len._3_1_ = pchRet3[0xb];
        str_00._M_len._4_1_ = pchRet3[0xc];
        str_00._M_len._5_1_ = pchRet3[0xd];
        str_00._M_len._6_1_ = pchRet3[0xe];
        str_00._M_len._7_1_ = pchRet3[0xf];
        logging_function_09._M_str = "Socks5";
        logging_function_09._M_len = 6;
        BCLog::Logger::LogPrintStr(pLVar7,str_00,logging_function_09,source_file_00,0x1ac,ALL,Error)
        ;
        goto LAB_00a9a89a;
      }
      goto LAB_00a9ab5b;
    }
LAB_00a9abbf:
    vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pchRet3[0] = '\x05';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = '\x03';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = (uint8_t)strDest->_M_string_length;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    _Var3._M_current = (strDest->_M_dataplus)._M_p;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vSocks5,
               (const_iterator)
               vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,_Var3,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(_Var3._M_current + strDest->_M_string_length));
    pchRet3[0] = port_local._1_1_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = (uint8_t)port_local;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    (*sock->_vptr_Sock[0x10])
              (sock,vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
               (long)vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,g_socks5_recv_timeout.__r,
               &g_socks5_interrupt);
    len = 4;
    IVar6 = InterruptibleRecv(pchRet2,4,g_socks5_recv_timeout,sock);
    if (IVar6 == OK) {
      if (pchRet2[0] != '\x05') {
        pcVar8 = "Proxy failed to accept request\n";
        iVar9 = 0x1c6;
        goto LAB_00a9ad1c;
      }
      if (pchRet2[1] != '\0') {
        bVar4 = LogAcceptCategory(NET,Debug);
        if (bVar4) {
          switch(pchRet2[1]) {
          case '\x01':
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"general failure",(allocator<char> *)&local_1f0);
            break;
          case '\x02':
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"connection not allowed",(allocator<char> *)&local_1f0);
            break;
          case '\x03':
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"network unreachable",(allocator<char> *)&local_1f0);
            break;
          case '\x04':
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"host unreachable",(allocator<char> *)&local_1f0);
            break;
          case '\x05':
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"connection refused",(allocator<char> *)&local_1f0);
            break;
          case '\x06':
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"TTL expired",(allocator<char> *)&local_1f0);
            break;
          case '\a':
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"protocol error",(allocator<char> *)&local_1f0);
            break;
          case '\b':
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"address type not supported",
                       (allocator<char> *)&local_1f0);
            break;
          default:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"unknown",(allocator<char> *)&local_1f0);
          }
          pLVar7 = LogInstance();
          bVar4 = BCLog::Logger::Enabled(pLVar7);
          if (bVar4) {
            pchRet3._0_8_ = pchRet3 + 0x10;
            pchRet3[8] = '\0';
            pchRet3[9] = '\0';
            pchRet3[10] = '\0';
            pchRet3[0xb] = '\0';
            pchRet3[0xc] = '\0';
            pchRet3[0xd] = '\0';
            pchRet3[0xe] = '\0';
            pchRet3[0xf] = '\0';
            pchRet3._16_8_ = pchRet3._16_8_ & 0xffffffffffffff00;
            tinyformat::format<std::__cxx11::string,unsigned_short,std::__cxx11::string>
                      ((string *)pchRetA,(tinyformat *)"Socks5() connect to %s:%d failed: %s\n",
                       (char *)strDest,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &port_local,(unsigned_short *)&local_d0,in_R9);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pchRet3,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pchRetA);
            std::__cxx11::string::~string((string *)pchRetA);
            pLVar7 = LogInstance();
            local_1f0 = 0x54;
            pcStack_1e8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
            source_file_01._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp"
            ;
            source_file_01._M_len = 0x54;
            str_01._M_str = (char *)pchRet3._0_8_;
            str_01._M_len._0_1_ = pchRet3[8];
            str_01._M_len._1_1_ = pchRet3[9];
            str_01._M_len._2_1_ = pchRet3[10];
            str_01._M_len._3_1_ = pchRet3[0xb];
            str_01._M_len._4_1_ = pchRet3[0xc];
            str_01._M_len._5_1_ = pchRet3[0xd];
            str_01._M_len._6_1_ = pchRet3[0xe];
            str_01._M_len._7_1_ = pchRet3[0xf];
            logging_function_10._M_str = "Socks5";
            logging_function_10._M_len = 6;
            BCLog::Logger::LogPrintStr
                      (pLVar7,str_01,logging_function_10,source_file_01,0x1cc,NET,Debug);
            std::__cxx11::string::~string((string *)pchRet3);
          }
          std::__cxx11::string::~string((string *)&local_d0);
        }
        goto LAB_00a9ad3e;
      }
      if (pchRet2[2] != '\0') {
        pcVar8 = "Error: malformed proxy response\n";
        iVar9 = 0x1d0;
        goto LAB_00a9ad1c;
      }
      if (pchRet2[3] != '\x01') {
        if (pchRet2[3] == '\x03') {
          IVar6 = InterruptibleRecv(pchRet3,1,g_socks5_recv_timeout,sock);
          if (IVar6 == OK) {
            IVar6 = InterruptibleRecv(pchRet3,pchRet3._0_8_ & 0xff,g_socks5_recv_timeout,sock);
            goto LAB_00a9ad97;
          }
          pcVar8 = "Error reading from proxy\n";
          iVar9 = 0x1da;
        }
        else {
          if (pchRet2[3] == '\x04') {
            len = 0x10;
            goto LAB_00a9ad83;
          }
          pcVar8 = "Error: malformed proxy response\n";
          iVar9 = 0x1e2;
        }
LAB_00a9ae57:
        source_file_10._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
        source_file_10._M_len = 0x54;
        logging_function_07._M_str = "Socks5";
        logging_function_07._M_len = 6;
        LogPrintf_<>(logging_function_07,source_file_10,iVar9,ALL,Error,pcVar8);
        goto LAB_00a9ad3e;
      }
LAB_00a9ad83:
      IVar6 = InterruptibleRecv(pchRet3,len,g_socks5_recv_timeout,sock);
LAB_00a9ad97:
      pcVar8 = "Error reading from proxy\n";
      iVar9 = 0x1e7;
      if (IVar6 != OK) goto LAB_00a9ae57;
      IVar6 = InterruptibleRecv(pchRet3,2,g_socks5_recv_timeout,sock);
      iVar9 = 0x1eb;
      if (IVar6 != OK) goto LAB_00a9ae57;
      bVar5 = LogAcceptCategory(NET,Debug);
      bVar4 = true;
      if (bVar5) {
        source_file_09._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
        source_file_09._M_len = 0x54;
        logging_function_06._M_str = "Socks5";
        logging_function_06._M_len = 6;
        LogPrintf_<std::__cxx11::string>
                  (logging_function_06,source_file_09,0x1ee,NET,Debug,"SOCKS5 connected %s\n",
                   strDest);
      }
    }
    else {
      if (IVar6 != Timeout) {
        pcVar8 = "Error while reading proxy response\n";
        iVar9 = 0x1c1;
LAB_00a9ad1c:
        source_file_08._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
        source_file_08._M_len = 0x54;
        logging_function_05._M_str = "Socks5";
        logging_function_05._M_len = 6;
        LogPrintf_<>(logging_function_05,source_file_08,iVar9,ALL,Error,pcVar8);
      }
LAB_00a9ad3e:
      bVar4 = false;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    pLVar7 = LogInstance();
    bVar4 = BCLog::Logger::Enabled(pLVar7);
    if (bVar4) {
      pchRet3._0_8_ = pchRet3 + 0x10;
      pchRet3[8] = '\0';
      pchRet3[9] = '\0';
      pchRet3[10] = '\0';
      pchRet3[0xb] = '\0';
      pchRet3[0xc] = '\0';
      pchRet3[0xd] = '\0';
      pchRet3[0xe] = '\0';
      pchRet3[0xf] = '\0';
      pchRet3._16_8_ = pchRet3._16_8_ & 0xffffffffffffff00;
      tinyformat::format<std::__cxx11::string,unsigned_short>
                ((string *)pchRetA,
                 (tinyformat *)
                 "Socks5() connect to %s:%d failed: InterruptibleRecv() timeout or other failure\n",
                 (char *)strDest,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&port_local,
                 (unsigned_short *)args_1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pchRet3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pchRetA);
      std::__cxx11::string::~string((string *)pchRetA);
      pLVar7 = LogInstance();
      local_d0 = 0x54;
      pcStack_c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netbase.cpp";
      source_file._M_len = 0x54;
      str._M_str = (char *)pchRet3._0_8_;
      str._M_len._0_1_ = pchRet3[8];
      str._M_len._1_1_ = pchRet3[9];
      str._M_len._2_1_ = pchRet3[10];
      str._M_len._3_1_ = pchRet3[0xb];
      str._M_len._4_1_ = pchRet3[0xc];
      str._M_len._5_1_ = pchRet3[0xd];
      str._M_len._6_1_ = pchRet3[0xe];
      str._M_len._7_1_ = pchRet3[0xf];
      logging_function_08._M_str = "Socks5";
      logging_function_08._M_len = 6;
      BCLog::Logger::LogPrintStr(pLVar7,str,logging_function_08,source_file,0x18b,ALL,Info);
LAB_00a9a89a:
      std::__cxx11::string::~string((string *)pchRet3);
    }
LAB_00a9ab5b:
    bVar4 = false;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_00a9ab67:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool Socks5(const std::string& strDest, uint16_t port, const ProxyCredentials* auth, const Sock& sock)
{
    try {
        IntrRecvError recvr;
        LogDebug(BCLog::NET, "SOCKS5 connecting %s\n", strDest);
        if (strDest.size() > 255) {
            LogError("Hostname too long\n");
            return false;
        }
        // Construct the version identifier/method selection message
        std::vector<uint8_t> vSocks5Init;
        vSocks5Init.push_back(SOCKSVersion::SOCKS5); // We want the SOCK5 protocol
        if (auth) {
            vSocks5Init.push_back(0x02); // 2 method identifiers follow...
            vSocks5Init.push_back(SOCKS5Method::NOAUTH);
            vSocks5Init.push_back(SOCKS5Method::USER_PASS);
        } else {
            vSocks5Init.push_back(0x01); // 1 method identifier follows...
            vSocks5Init.push_back(SOCKS5Method::NOAUTH);
        }
        sock.SendComplete(vSocks5Init, g_socks5_recv_timeout, g_socks5_interrupt);
        uint8_t pchRet1[2];
        if (InterruptibleRecv(pchRet1, 2, g_socks5_recv_timeout, sock) != IntrRecvError::OK) {
            LogPrintf("Socks5() connect to %s:%d failed: InterruptibleRecv() timeout or other failure\n", strDest, port);
            return false;
        }
        if (pchRet1[0] != SOCKSVersion::SOCKS5) {
            LogError("Proxy failed to initialize\n");
            return false;
        }
        if (pchRet1[1] == SOCKS5Method::USER_PASS && auth) {
            // Perform username/password authentication (as described in RFC1929)
            std::vector<uint8_t> vAuth;
            vAuth.push_back(0x01); // Current (and only) version of user/pass subnegotiation
            if (auth->username.size() > 255 || auth->password.size() > 255) {
                LogError("Proxy username or password too long\n");
                return false;
            }
            vAuth.push_back(auth->username.size());
            vAuth.insert(vAuth.end(), auth->username.begin(), auth->username.end());
            vAuth.push_back(auth->password.size());
            vAuth.insert(vAuth.end(), auth->password.begin(), auth->password.end());
            sock.SendComplete(vAuth, g_socks5_recv_timeout, g_socks5_interrupt);
            LogDebug(BCLog::PROXY, "SOCKS5 sending proxy authentication %s:%s\n", auth->username, auth->password);
            uint8_t pchRetA[2];
            if (InterruptibleRecv(pchRetA, 2, g_socks5_recv_timeout, sock) != IntrRecvError::OK) {
                LogError("Error reading proxy authentication response\n");
                return false;
            }
            if (pchRetA[0] != 0x01 || pchRetA[1] != 0x00) {
                LogError("Proxy authentication unsuccessful\n");
                return false;
            }
        } else if (pchRet1[1] == SOCKS5Method::NOAUTH) {
            // Perform no authentication
        } else {
            LogError("Proxy requested wrong authentication method %02x\n", pchRet1[1]);
            return false;
        }
        std::vector<uint8_t> vSocks5;
        vSocks5.push_back(SOCKSVersion::SOCKS5);   // VER protocol version
        vSocks5.push_back(SOCKS5Command::CONNECT); // CMD CONNECT
        vSocks5.push_back(0x00);                   // RSV Reserved must be 0
        vSocks5.push_back(SOCKS5Atyp::DOMAINNAME); // ATYP DOMAINNAME
        vSocks5.push_back(strDest.size());         // Length<=255 is checked at beginning of function
        vSocks5.insert(vSocks5.end(), strDest.begin(), strDest.end());
        vSocks5.push_back((port >> 8) & 0xFF);
        vSocks5.push_back((port >> 0) & 0xFF);
        sock.SendComplete(vSocks5, g_socks5_recv_timeout, g_socks5_interrupt);
        uint8_t pchRet2[4];
        if ((recvr = InterruptibleRecv(pchRet2, 4, g_socks5_recv_timeout, sock)) != IntrRecvError::OK) {
            if (recvr == IntrRecvError::Timeout) {
                /* If a timeout happens here, this effectively means we timed out while connecting
                 * to the remote node. This is very common for Tor, so do not print an
                 * error message. */
                return false;
            } else {
                LogError("Error while reading proxy response\n");
                return false;
            }
        }
        if (pchRet2[0] != SOCKSVersion::SOCKS5) {
            LogError("Proxy failed to accept request\n");
            return false;
        }
        if (pchRet2[1] != SOCKS5Reply::SUCCEEDED) {
            // Failures to connect to a peer that are not proxy errors
            LogPrintLevel(BCLog::NET, BCLog::Level::Debug,
                          "Socks5() connect to %s:%d failed: %s\n", strDest, port, Socks5ErrorString(pchRet2[1]));
            return false;
        }
        if (pchRet2[2] != 0x00) { // Reserved field must be 0
            LogError("Error: malformed proxy response\n");
            return false;
        }
        uint8_t pchRet3[256];
        switch (pchRet2[3]) {
        case SOCKS5Atyp::IPV4: recvr = InterruptibleRecv(pchRet3, 4, g_socks5_recv_timeout, sock); break;
        case SOCKS5Atyp::IPV6: recvr = InterruptibleRecv(pchRet3, 16, g_socks5_recv_timeout, sock); break;
        case SOCKS5Atyp::DOMAINNAME: {
            recvr = InterruptibleRecv(pchRet3, 1, g_socks5_recv_timeout, sock);
            if (recvr != IntrRecvError::OK) {
                LogError("Error reading from proxy\n");
                return false;
            }
            int nRecv = pchRet3[0];
            recvr = InterruptibleRecv(pchRet3, nRecv, g_socks5_recv_timeout, sock);
            break;
        }
        default: {
            LogError("Error: malformed proxy response\n");
            return false;
        }
        }
        if (recvr != IntrRecvError::OK) {
            LogError("Error reading from proxy\n");
            return false;
        }
        if (InterruptibleRecv(pchRet3, 2, g_socks5_recv_timeout, sock) != IntrRecvError::OK) {
            LogError("Error reading from proxy\n");
            return false;
        }
        LogDebug(BCLog::NET, "SOCKS5 connected %s\n", strDest);
        return true;
    } catch (const std::runtime_error& e) {
        LogError("Error during SOCKS5 proxy handshake: %s\n", e.what());
        return false;
    }
}